

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _utils.c
# Opt level: O2

longlong bm_run_n(uint n,_func_void_varargs *test_fn)

{
  bool bVar1;
  timespec ts_begin;
  timespec ts_end;
  
  timespec_get(&ts_begin,1);
  while (bVar1 = n != 0, n = n - 1, bVar1) {
    (*test_fn)();
  }
  timespec_get(&ts_end,1);
  return (ts_end.tv_nsec - ts_begin.tv_nsec) + (ts_end.tv_sec - ts_begin.tv_sec) * 1000000000;
}

Assistant:

long long bm_run_n(unsigned n, void (*test_fn)()) {
    struct timespec ts_begin;
    timespec_get(&ts_begin, TIME_UTC);

    for (unsigned i = 0; i < n; i++)
        test_fn();

    struct timespec ts_end;
    timespec_get(&ts_end, TIME_UTC);

    return (ts_end.tv_sec * 1000000000 + ts_end.tv_nsec) - (ts_begin.tv_sec * 1000000000 + ts_begin.tv_nsec);
}